

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O0

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetAndUpdateVerbose_Test::TestBody
          (OsqpTest_GetAndUpdateVerbose_Test *this)

{
  bool bVar1;
  char *pcVar2;
  bool *pbVar3;
  char *in_R9;
  string local_390;
  AssertHelper local_370;
  Message local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_330;
  Message local_328;
  bool local_319;
  undefined1 local_318 [8];
  AssertionResult gtest_ar__4;
  StatusOr<bool> verbose_1;
  AssertHelper local_2d8;
  Message local_2d0;
  Status local_2c8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_288;
  Message local_280;
  bool local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_240;
  Message local_238;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__1;
  StatusOr<bool> verbose;
  Message local_200;
  OsqpExitCode local_1f8;
  OsqpExitCode local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar;
  string local_1d8;
  AssertHelper local_1b8;
  Message local_1b0 [3];
  OsqpInstance local_198;
  Status local_d8;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  OsqpSolver solver;
  OsqpSettings settings;
  OsqpTest_GetAndUpdateVerbose_Test *this_local;
  
  OsqpSettings::OsqpSettings((OsqpSettings *)&solver);
  OsqpSolver::OsqpSolver((OsqpSolver *)&gtest_ar_.message_);
  GetToyProblem();
  OsqpSolver::Init((OsqpSolver *)&local_d8,(OsqpInstance *)&gtest_ar_.message_,
                   (OsqpSettings *)&local_198);
  local_c9 = absl::Status::ok(&local_d8);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c8,&local_c9,(type *)0x0)
  ;
  absl::Status::~Status(&local_d8);
  OsqpInstance::~OsqpInstance(&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d8,(internal *)local_c8,
               (AssertionResult *)"solver.Init(GetToyProblem(), settings).ok()","false","true",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x329,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b8,local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    testing::Message::~Message(local_1b0);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_1f4 = OsqpSolver::Solve((OsqpSolver *)&gtest_ar_.message_);
    local_1f8 = kOptimal;
    testing::internal::EqHelper::Compare<osqp::OsqpExitCode,_osqp::OsqpExitCode,_nullptr>
              ((EqHelper *)local_1f0,"solver.Solve()","OsqpExitCode::kOptimal",&local_1f4,&local_1f8
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
    if (!bVar1) {
      testing::Message::Message(&local_200);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&verbose.super_StatusOrData<bool>.field_1,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                 ,0x32a,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&verbose.super_StatusOrData<bool>.field_1,&local_200);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)&verbose.super_StatusOrData<bool>.field_1);
      testing::Message::~Message(&local_200);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      OsqpSolver::GetVerbose((OsqpSolver *)&gtest_ar__1.message_);
      local_229 = absl::StatusOr<bool>::ok((StatusOr<bool> *)&gtest_ar__1.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_228,&local_229,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
      if (!bVar1) {
        testing::Message::Message(&local_238);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_228,
                   (AssertionResult *)"verbose.ok()","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_240,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0x32e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_240,&local_238);
        testing::internal::AssertHelper::~AssertHelper(&local_240);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_238);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pbVar3 = absl::StatusOr<bool>::operator*((StatusOr<bool> *)&gtest_ar__1.message_);
        local_271 = (bool)(~*pbVar3 & 1);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_270,&local_271,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
        if (!bVar1) {
          testing::Message::Message(&local_280);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__3.message_,(internal *)local_270,
                     (AssertionResult *)"*verbose","true","false",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_288,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,0x32f,pcVar2);
          testing::internal::AssertHelper::operator=(&local_288,&local_280);
          testing::internal::AssertHelper::~AssertHelper(&local_288);
          std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_280);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
      absl::StatusOr<bool>::~StatusOr((StatusOr<bool> *)&gtest_ar__1.message_);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        OsqpSolver::UpdateVerbose((OsqpSolver *)&local_2c8,(bool)((char)&gtest_ar_ + '\b'));
        local_2b9 = absl::Status::ok(&local_2c8);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
        absl::Status::~Status(&local_2c8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
        if (!bVar1) {
          testing::Message::Message(&local_2d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&verbose_1.super_StatusOrData<bool>.field_1,(internal *)local_2b8,
                     (AssertionResult *)"solver.UpdateVerbose(true).ok()","false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,0x332,pcVar2);
          testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
          testing::internal::AssertHelper::~AssertHelper(&local_2d8);
          std::__cxx11::string::~string((string *)&verbose_1.super_StatusOrData<bool>.field_1);
          testing::Message::~Message(&local_2d0);
        }
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          OsqpSolver::GetVerbose((OsqpSolver *)&gtest_ar__4.message_);
          local_319 = absl::StatusOr<bool>::ok((StatusOr<bool> *)&gtest_ar__4.message_);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_318,&local_319,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
          if (!bVar1) {
            testing::Message::Message(&local_328);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_318,
                       (AssertionResult *)"verbose.ok()","false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_330,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                       ,0x335,pcVar2);
            testing::internal::AssertHelper::operator=(&local_330,&local_328);
            testing::internal::AssertHelper::~AssertHelper(&local_330);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_328);
          }
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
          if (gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pbVar3 = absl::StatusOr<bool>::operator*((StatusOr<bool> *)&gtest_ar__4.message_);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_360,pbVar3,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
            if (!bVar1) {
              testing::Message::Message(&local_368);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_390,(internal *)local_360,(AssertionResult *)"*verbose","false",
                         "true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_370,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                         ,0x336,pcVar2);
              testing::internal::AssertHelper::operator=(&local_370,&local_368);
              testing::internal::AssertHelper::~AssertHelper(&local_370);
              std::__cxx11::string::~string((string *)&local_390);
              testing::Message::~Message(&local_368);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = 0;
          }
          absl::StatusOr<bool>::~StatusOr((StatusOr<bool> *)&gtest_ar__4.message_);
          if (gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = 0;
          }
        }
      }
    }
  }
  OsqpSolver::~OsqpSolver((OsqpSolver *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(OsqpTest, GetAndUpdateVerbose) {
  OsqpSettings settings;
  settings.verbose = false;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  {
    const auto verbose = solver.GetVerbose();
    ASSERT_TRUE(verbose.ok());
    EXPECT_FALSE(*verbose);
  }

  ASSERT_TRUE(solver.UpdateVerbose(true).ok());
  {
    const auto verbose = solver.GetVerbose();
    ASSERT_TRUE(verbose.ok());
    EXPECT_TRUE(*verbose);
  }
}